

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

void stb_leakcheck_free(void *ptr)

{
  code *pcVar1;
  stb__leakcheck_malloc_info *psVar2;
  
  *(ulong *)((long)ptr + -0x18) = ~*(ulong *)((long)ptr + -0x18);
  LOCK();
  UNLOCK();
  if (mi_lock != 0) {
    do {
    } while( true );
  }
  if (*(long *)((long)ptr + -8) == 0) {
    if (mi_head != (stb__leakcheck_malloc_info *)((long)ptr + -0xe0)) {
      mi_lock = 1;
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/allocator.c"
                        ,0x90,"mi_head == mi");
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    psVar2 = *(stb__leakcheck_malloc_info **)((long)ptr + -0x10);
    mi_head = psVar2;
  }
  else {
    psVar2 = *(stb__leakcheck_malloc_info **)((long)ptr + -0x10);
    *(stb__leakcheck_malloc_info **)(*(long *)((long)ptr + -8) + 0xd0) = psVar2;
  }
  if (psVar2 != (stb__leakcheck_malloc_info *)0x0) {
    psVar2->prev = *(stb__leakcheck_malloc_info **)((long)ptr + -8);
  }
  mi_lock = 0;
  free((stb__leakcheck_malloc_info *)((long)ptr + -0xe0));
  return;
}

Assistant:

static void stb_leakcheck_free(void* ptr)
{
    if (ptr != NULL) {
        stb__leakcheck_malloc_info* mi = (stb__leakcheck_malloc_info*)ptr - 1;
        mi->size = ~mi->size;
        sx_lock(mi_lock) {
            if (mi->prev == NULL) {
                sx_assert(mi_head == mi);
                mi_head = mi->next;
            } else
                mi->prev->next = mi->next;
            if (mi->next)
                mi->next->prev = mi->prev;
        }
        free(mi);
    }
}